

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int eval_function_call(lyxp_expr *exp,uint16_t *exp_idx,lyd_node *cur_node,lys_module *param_4,
                      lyxp_set *set,int options)

{
  uint16_t uVar1;
  bool bVar2;
  ushort uVar3;
  int iVar4;
  char *pcVar5;
  undefined8 *__ptr;
  lyxp_set *plVar6;
  LY_ERR *pLVar7;
  code *pcVar8;
  ushort uVar9;
  ushort uVar10;
  undefined8 *__ptr_00;
  ulong uVar11;
  char *pcVar12;
  bool bVar13;
  int local_4c;
  code *local_40;
  
  if (set == (lyxp_set *)0x0) {
    local_40 = (code *)0x0;
    goto LAB_0016e141;
  }
  uVar10 = *exp_idx;
  bVar2 = true;
  local_40 = (code *)0x0;
  switch(exp->tok_len[uVar10]) {
  case '\x03':
    uVar3 = exp->expr_pos[uVar10];
    pcVar12 = exp->expr;
    iVar4 = strncmp(pcVar12 + uVar3,"not",3);
    if (iVar4 == 0) {
      local_40 = xpath_not;
      break;
    }
    iVar4 = strncmp(pcVar12 + uVar3,"sum",3);
    bVar13 = iVar4 == 0;
    bVar2 = !bVar13;
    pcVar8 = xpath_sum;
LAB_0016df9c:
    local_40 = (code *)0x0;
    if (bVar13) {
      local_40 = pcVar8;
    }
    goto switchD_0016db0f_caseD_e;
  case '\x04':
    pcVar12 = exp->expr + exp->expr_pos[uVar10];
    iVar4 = strncmp(pcVar12,"lang",4);
    if (iVar4 == 0) {
      local_40 = xpath_lang;
    }
    else {
      iVar4 = strncmp(pcVar12,"last",4);
      if (iVar4 == 0) {
        local_40 = xpath_last;
      }
      else {
        iVar4 = strncmp(pcVar12,"name",4);
        if (iVar4 != 0) {
          iVar4 = strncmp(pcVar12,"true",4);
          bVar13 = iVar4 == 0;
          bVar2 = !bVar13;
          pcVar8 = xpath_true;
          goto LAB_0016df9c;
        }
        local_40 = xpath_name;
      }
    }
    break;
  case '\x05':
    pcVar12 = exp->expr + exp->expr_pos[uVar10];
    iVar4 = strncmp(pcVar12,"count",5);
    if (iVar4 == 0) {
      local_40 = xpath_count;
    }
    else {
      iVar4 = strncmp(pcVar12,"false",5);
      if (iVar4 == 0) {
        local_40 = xpath_false;
      }
      else {
        iVar4 = strncmp(pcVar12,"floor",5);
        if (iVar4 == 0) {
          local_40 = xpath_floor;
        }
        else {
          iVar4 = strncmp(pcVar12,"round",5);
          if (iVar4 != 0) {
            iVar4 = strncmp(pcVar12,"deref",5);
            bVar13 = iVar4 == 0;
            bVar2 = !bVar13;
            pcVar8 = xpath_deref;
            goto LAB_0016df9c;
          }
          local_40 = xpath_round;
        }
      }
    }
    break;
  case '\x06':
    pcVar12 = exp->expr + exp->expr_pos[uVar10];
    iVar4 = strncmp(pcVar12,"concat",6);
    if (iVar4 == 0) {
      local_40 = xpath_concat;
    }
    else {
      iVar4 = strncmp(pcVar12,"number",6);
      if (iVar4 != 0) {
        iVar4 = strncmp(pcVar12,"string",6);
        bVar13 = iVar4 == 0;
        bVar2 = !bVar13;
        pcVar8 = xpath_string;
        goto LAB_0016df9c;
      }
      local_40 = xpath_number;
    }
    break;
  case '\a':
    pcVar12 = exp->expr + exp->expr_pos[uVar10];
    iVar4 = strncmp(pcVar12,"boolean",7);
    if (iVar4 == 0) {
      local_40 = xpath_boolean;
    }
    else {
      iVar4 = strncmp(pcVar12,"ceiling",7);
      if (iVar4 != 0) {
        iVar4 = strncmp(pcVar12,"current",7);
        bVar13 = iVar4 == 0;
        bVar2 = !bVar13;
        pcVar8 = xpath_current;
        goto LAB_0016df9c;
      }
      local_40 = xpath_ceiling;
    }
    break;
  case '\b':
    pcVar12 = exp->expr + exp->expr_pos[uVar10];
    iVar4 = strncmp(pcVar12,"contains",8);
    if (iVar4 == 0) {
      local_40 = xpath_contains;
    }
    else {
      iVar4 = strncmp(pcVar12,"position",8);
      if (iVar4 != 0) {
        iVar4 = strncmp(pcVar12,"re-match",8);
        bVar13 = iVar4 == 0;
        bVar2 = !bVar13;
        pcVar8 = xpath_re_match;
        goto LAB_0016df9c;
      }
      local_40 = xpath_position;
    }
    break;
  case '\t':
    uVar3 = exp->expr_pos[uVar10];
    pcVar12 = exp->expr;
    iVar4 = strncmp(pcVar12 + uVar3,"substring",9);
    if (iVar4 != 0) {
      iVar4 = strncmp(pcVar12 + uVar3,"translate",9);
      bVar13 = iVar4 == 0;
      bVar2 = !bVar13;
      pcVar8 = xpath_translate;
      goto LAB_0016df9c;
    }
    local_40 = xpath_substring;
    break;
  case '\n':
    pcVar12 = exp->expr + exp->expr_pos[uVar10];
    iVar4 = strncmp(pcVar12,"local-name",10);
    if (iVar4 == 0) {
      local_40 = xpath_local_name;
    }
    else {
      iVar4 = strncmp(pcVar12,"enum-value",10);
      if (iVar4 != 0) {
        iVar4 = strncmp(pcVar12,"bit-is-set",10);
        bVar13 = iVar4 == 0;
        bVar2 = !bVar13;
        pcVar8 = xpath_bit_is_set;
        goto LAB_0016df9c;
      }
      local_40 = xpath_enum_value;
    }
    break;
  case '\v':
    iVar4 = strncmp(exp->expr + exp->expr_pos[uVar10],"starts-with",0xb);
    bVar13 = iVar4 == 0;
    bVar2 = !bVar13;
    pcVar8 = xpath_starts_with;
    goto LAB_0016e00b;
  case '\f':
    iVar4 = strncmp(exp->expr + exp->expr_pos[uVar10],"derived-from",0xc);
    bVar13 = iVar4 == 0;
    bVar2 = !bVar13;
    pcVar8 = xpath_derived_from;
    goto LAB_0016e00b;
  case '\r':
    uVar3 = exp->expr_pos[uVar10];
    pcVar12 = exp->expr;
    iVar4 = strncmp(pcVar12 + uVar3,"namespace-uri",0xd);
    if (iVar4 != 0) {
      iVar4 = strncmp(pcVar12 + uVar3,"string-length",0xd);
      bVar13 = iVar4 == 0;
      bVar2 = !bVar13;
      pcVar8 = xpath_string_length;
      goto LAB_0016df9c;
    }
    local_40 = xpath_namespace_uri;
    break;
  default:
    goto switchD_0016db0f_caseD_e;
  case '\x0f':
    uVar3 = exp->expr_pos[uVar10];
    pcVar12 = exp->expr;
    iVar4 = strncmp(pcVar12 + uVar3,"normalize-space",0xf);
    if (iVar4 != 0) {
      iVar4 = strncmp(pcVar12 + uVar3,"substring-after",0xf);
      bVar13 = iVar4 == 0;
      bVar2 = !bVar13;
      pcVar8 = xpath_substring_after;
      goto LAB_0016df9c;
    }
    local_40 = xpath_normalize_space;
    break;
  case '\x10':
    iVar4 = strncmp(exp->expr + exp->expr_pos[uVar10],"substring-before",0x10);
    bVar13 = iVar4 == 0;
    bVar2 = !bVar13;
    pcVar8 = xpath_substring_before;
    goto LAB_0016e00b;
  case '\x14':
    iVar4 = strncmp(exp->expr + exp->expr_pos[uVar10],"derived-from-or-self",0x14);
    bVar13 = iVar4 == 0;
    bVar2 = !bVar13;
    pcVar8 = xpath_derived_from_or_self;
LAB_0016e00b:
    local_40 = (code *)0x0;
    if (bVar13) {
      local_40 = pcVar8;
    }
    goto switchD_0016db0f_caseD_e;
  }
  bVar2 = false;
switchD_0016db0f_caseD_e:
  if (bVar2) {
    ly_vlog(LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,"Unknown",exp->expr + exp->expr_pos[uVar10]);
    ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Unknown XPath function \"%.*s\".",
            (ulong)exp->tok_len[*exp_idx],exp->expr + exp->expr_pos[*exp_idx]);
    return -1;
  }
LAB_0016e141:
  if ('\x02' < ly_log_level) {
    pcVar12 = "parsed";
    if (set == (lyxp_set *)0x0) {
      pcVar12 = "skipped";
    }
    pcVar5 = print_token(exp->tokens[*exp_idx]);
    ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_function_call",pcVar12,pcVar5,
               (ulong)exp->expr_pos[*exp_idx]);
  }
  uVar1 = *exp_idx;
  *exp_idx = uVar1 + 1;
  if ('\x02' < ly_log_level) {
    pcVar12 = "parsed";
    if (set == (lyxp_set *)0x0) {
      pcVar12 = "skipped";
    }
    pcVar5 = print_token(exp->tokens[(ushort)(uVar1 + 1)]);
    ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_function_call",pcVar12,pcVar5,
               (ulong)exp->expr_pos[*exp_idx]);
  }
  uVar1 = *exp_idx;
  *exp_idx = uVar1 + 1;
  if (exp->tokens[(ushort)(uVar1 + 1)] == LYXP_TOKEN_PAR2) {
    local_4c = 1;
    uVar10 = 0;
    __ptr_00 = (undefined8 *)0x0;
  }
  else if (set == (lyxp_set *)0x0) {
    local_4c = eval_expr(exp,exp_idx,cur_node,param_4,(lyxp_set *)0x0,options);
    if (local_4c != 0) {
      __ptr = (undefined8 *)0x0;
      uVar10 = 0;
      goto LAB_0016e55b;
    }
    local_4c = 0;
    __ptr_00 = (undefined8 *)0x0;
    uVar10 = 0;
  }
  else {
    __ptr = (undefined8 *)malloc(8);
    if (__ptr == (undefined8 *)0x0) {
      pLVar7 = ly_errno_location();
      *pLVar7 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","eval_function_call");
      local_4c = 1;
      __ptr = (undefined8 *)0x0;
      uVar10 = 0;
      goto LAB_0016e55b;
    }
    plVar6 = set_copy(set);
    *__ptr = plVar6;
    if (plVar6 == (lyxp_set *)0x0) {
      local_4c = 1;
      uVar10 = 1;
      goto LAB_0016e55b;
    }
    local_4c = eval_expr(exp,exp_idx,cur_node,param_4,plVar6,options);
    uVar10 = 1;
    if (local_4c != 0) goto LAB_0016e55b;
    local_4c = 0;
    __ptr_00 = __ptr;
  }
  uVar3 = *exp_idx;
  __ptr = __ptr_00;
  if (uVar3 < exp->used) {
    pcVar12 = "parsed";
    uVar9 = uVar10;
    if (set == (lyxp_set *)0x0) {
      pcVar12 = "skipped";
    }
    do {
      __ptr = __ptr_00;
      uVar10 = uVar9;
      if (exp->tokens[uVar3] != LYXP_TOKEN_COMMA) break;
      if ('\x02' < ly_log_level) {
        pcVar5 = print_token(LYXP_TOKEN_COMMA);
        ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_function_call",pcVar12,pcVar5,
                   (ulong)exp->expr_pos[*exp_idx]);
      }
      *exp_idx = *exp_idx + 1;
      if (set == (lyxp_set *)0x0) {
        local_4c = eval_expr(exp,exp_idx,cur_node,param_4,(lyxp_set *)0x0,options);
      }
      else {
        uVar10 = uVar9 + 1;
        __ptr = (undefined8 *)realloc(__ptr_00,(ulong)((uint)uVar10 * 8));
        if (__ptr == (undefined8 *)0x0) {
          pLVar7 = ly_errno_location();
          *pLVar7 = LY_EMEM;
          ly_log(LY_LLERR,"Memory allocation failed (%s()).","eval_function_call");
          __ptr = __ptr_00;
          uVar10 = uVar9;
          goto LAB_0016e55b;
        }
        plVar6 = set_copy(set);
        __ptr[(ulong)(uint)uVar10 - 1] = plVar6;
        if (plVar6 == (lyxp_set *)0x0) goto LAB_0016e55b;
        local_4c = eval_expr(exp,exp_idx,cur_node,param_4,plVar6,options);
        __ptr_00 = __ptr;
      }
      __ptr = __ptr_00;
      if (local_4c != 0) goto LAB_0016e55b;
      uVar3 = *exp_idx;
      local_4c = 0;
      uVar9 = uVar10;
    } while (uVar3 < exp->used);
  }
  if ('\x02' < ly_log_level) {
    pcVar12 = "parsed";
    if (set == (lyxp_set *)0x0) {
      pcVar12 = "skipped";
    }
    pcVar5 = print_token(exp->tokens[uVar3]);
    ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_function_call",pcVar12,pcVar5,
               (ulong)exp->expr_pos[*exp_idx]);
  }
  *exp_idx = *exp_idx + 1;
  if (set == (lyxp_set *)0x0) {
    local_4c = 0;
  }
  else {
    local_4c = (*local_40)(__ptr,uVar10,cur_node,param_4,set,options);
  }
LAB_0016e55b:
  if (uVar10 != 0) {
    uVar11 = 0;
    do {
      lyxp_set_free((lyxp_set *)__ptr[uVar11]);
      uVar11 = uVar11 + 1;
    } while (uVar10 != uVar11);
  }
  free(__ptr);
  return local_4c;
}

Assistant:

static int
eval_function_call(struct lyxp_expr *exp, uint16_t *exp_idx, struct lyd_node *cur_node, struct lys_module *local_mod,
                   struct lyxp_set *set, int options)
{
    int rc = EXIT_FAILURE;
    int (*xpath_func)(struct lyxp_set **, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int) = NULL;
    uint16_t arg_count = 0, i;
    struct lyxp_set **args = NULL, **args_aux;

    if (set) {
        /* FunctionName */
        switch (exp->tok_len[*exp_idx]) {
        case 3:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "not", 3)) {
                xpath_func = &xpath_not;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "sum", 3)) {
                xpath_func = &xpath_sum;
            }
            break;
        case 4:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "lang", 4)) {
                xpath_func = &xpath_lang;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "last", 4)) {
                xpath_func = &xpath_last;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "name", 4)) {
                xpath_func = &xpath_name;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "true", 4)) {
                xpath_func = &xpath_true;
            }
            break;
        case 5:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "count", 5)) {
                xpath_func = &xpath_count;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "false", 5)) {
                xpath_func = &xpath_false;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "floor", 5)) {
                xpath_func = &xpath_floor;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "round", 5)) {
                xpath_func = &xpath_round;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "deref", 5)) {
                xpath_func = &xpath_deref;
            }
            break;
        case 6:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "concat", 6)) {
                xpath_func = &xpath_concat;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "number", 6)) {
                xpath_func = &xpath_number;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "string", 6)) {
                xpath_func = &xpath_string;
            }
            break;
        case 7:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "boolean", 7)) {
                xpath_func = &xpath_boolean;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "ceiling", 7)) {
                xpath_func = &xpath_ceiling;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "current", 7)) {
                xpath_func = &xpath_current;
            }
            break;
        case 8:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "contains", 8)) {
                xpath_func = &xpath_contains;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "position", 8)) {
                xpath_func = &xpath_position;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "re-match", 8)) {
                xpath_func = &xpath_re_match;
            }
            break;
        case 9:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "substring", 9)) {
                xpath_func = &xpath_substring;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "translate", 9)) {
                xpath_func = &xpath_translate;
            }
            break;
        case 10:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "local-name", 10)) {
                xpath_func = &xpath_local_name;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "enum-value", 10)) {
                xpath_func = &xpath_enum_value;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "bit-is-set", 10)) {
                xpath_func = &xpath_bit_is_set;
            }
            break;
        case 11:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "starts-with", 11)) {
                xpath_func = &xpath_starts_with;
            }
            break;
        case 12:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "derived-from", 12)) {
                xpath_func = &xpath_derived_from;
            }
            break;
        case 13:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "namespace-uri", 13)) {
                xpath_func = &xpath_namespace_uri;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "string-length", 13)) {
                xpath_func = &xpath_string_length;
            }
            break;
        case 15:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "normalize-space", 15)) {
                xpath_func = &xpath_normalize_space;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "substring-after", 15)) {
                xpath_func = &xpath_substring_after;
            }
            break;
        case 16:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "substring-before", 16)) {
                xpath_func = &xpath_substring_before;
            }
            break;
        case 20:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "derived-from-or-self", 20)) {
                xpath_func = &xpath_derived_from_or_self;
            }
            break;
        }

        if (!xpath_func) {
            LOGVAL(LYE_XPATH_INTOK, LY_VLOG_NONE, NULL, "Unknown", &exp->expr[exp->expr_pos[*exp_idx]]);
            LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL,
                   "Unknown XPath function \"%.*s\".", exp->tok_len[*exp_idx], &exp->expr[exp->expr_pos[*exp_idx]]);
            return -1;
        }
    }

    LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
    ++(*exp_idx);

    /* '(' */
    LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
    ++(*exp_idx);

    /* ( Expr ( ',' Expr )* )? */
    if (exp->tokens[*exp_idx] != LYXP_TOKEN_PAR2) {
        if (set) {
            args = malloc(sizeof *args);
            if (!args) {
                LOGMEM;
                goto cleanup;
            }
            arg_count = 1;
            args[0] = set_copy(set);
            if (!args[0]) {
                goto cleanup;
            }

            if ((rc = eval_expr(exp, exp_idx, cur_node, local_mod, args[0], options))) {
                goto cleanup;
            }
        } else {
            if ((rc = eval_expr(exp, exp_idx, cur_node, local_mod, NULL, options))) {
                goto cleanup;
            }
        }
    }
    while ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_COMMA)) {
        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
        ++(*exp_idx);

        if (set) {
            ++arg_count;
            args_aux = realloc(args, arg_count * sizeof *args);
            if (!args_aux) {
                arg_count--;
                LOGMEM;
                goto cleanup;
            }
            args = args_aux;
            args[arg_count - 1] = set_copy(set);
            if (!args[arg_count - 1]) {
                goto cleanup;
            }

            if ((rc = eval_expr(exp, exp_idx, cur_node, local_mod, args[arg_count - 1], options))) {
                goto cleanup;
            }
        } else {
            if ((rc = eval_expr(exp, exp_idx, cur_node, local_mod, NULL, options))) {
                goto cleanup;
            }
        }
    }

    /* ')' */
    LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
    ++(*exp_idx);

    if (set) {
        /* evaluate function */
        rc = xpath_func(args, arg_count, cur_node, local_mod, set, options);
    } else {
        rc = EXIT_SUCCESS;
    }

cleanup:
    for (i = 0; i < arg_count; ++i) {
        lyxp_set_free(args[i]);
    }
    free(args);

    return rc;
}